

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_list.c
# Opt level: O2

ion_status_t sl_insert(ion_skiplist_t *skiplist,ion_key_t key,ion_value_t value)

{
  int iVar1;
  char cVar2;
  ion_sl_level_t iVar3;
  size_t __size;
  sl_node *__ptr;
  void *__ptr_00;
  void *__dest;
  sl_node *psVar4;
  sl_node **ppsVar5;
  ion_status_t iVar6;
  uint uVar10;
  ion_sl_node_t *piVar11;
  ion_status_t iVar7;
  ion_status_t iVar8;
  ion_status_t iVar9;
  
  iVar1 = (skiplist->super).record.key_size;
  __size = (size_t)(skiplist->super).record.value_size;
  __ptr = (sl_node *)malloc(0x20);
  if (__ptr == (sl_node *)0x0) {
    iVar9.error = '\x06';
    iVar9._1_3_ = 0;
    iVar9.count = 0;
    return iVar9;
  }
  __ptr_00 = malloc((long)iVar1);
  __ptr->key = __ptr_00;
  if (__ptr_00 == (void *)0x0) {
LAB_00105e1e:
    free(__ptr);
  }
  else {
    __dest = malloc(__size);
    __ptr->value = __dest;
    if (__dest == (void *)0x0) {
      free(__ptr_00);
    }
    else {
      memcpy(__ptr_00,key,(long)iVar1);
      memcpy(__dest,value,__size);
      psVar4 = sl_find_node(skiplist,key);
      if ((psVar4->key == (ion_key_t)0x0) ||
         (cVar2 = (*(skiplist->super).compare)(psVar4->key,key,iVar1), cVar2 != '\0')) {
        iVar3 = sl_gen_level(skiplist);
        __ptr->height = iVar3;
        ppsVar5 = (sl_node **)malloc((long)iVar3 * 8 + 8);
        __ptr->next = ppsVar5;
        if (ppsVar5 != (sl_node **)0x0) {
          psVar4 = skiplist->head;
          for (uVar10 = psVar4->height; -1 < (int)uVar10; uVar10 = uVar10 - 1) {
            while ((psVar4->next[uVar10] != (sl_node *)0x0 &&
                   (cVar2 = (*(skiplist->super).compare)(key,psVar4->next[uVar10]->key,iVar1),
                   -1 < cVar2))) {
              psVar4 = psVar4->next[uVar10];
            }
            if ((int)uVar10 <= __ptr->height) {
              __ptr->next[uVar10] = psVar4->next[uVar10];
              psVar4->next[uVar10] = __ptr;
            }
          }
          iVar8.error = '\0';
          iVar8._1_3_ = 0;
          iVar8.count = 1;
          return iVar8;
        }
        free(__ptr->value);
        free(__ptr->key);
        goto LAB_00105e1e;
      }
      __ptr->height = 0;
      ppsVar5 = (sl_node **)malloc(8);
      __ptr->next = ppsVar5;
      if (ppsVar5 != (sl_node **)0x0) {
        do {
          piVar11 = psVar4;
          if (*piVar11->next == (sl_node *)0x0) {
            psVar4 = (sl_node *)0x0;
            break;
          }
          cVar2 = (*(skiplist->super).compare)((*piVar11->next)->key,key,iVar1);
          psVar4 = *piVar11->next;
        } while (cVar2 == '\0');
        *__ptr->next = psVar4;
        *piVar11->next = __ptr;
        iVar7.error = '\0';
        iVar7._1_3_ = 0;
        iVar7.count = 1;
        return iVar7;
      }
      free(__ptr->value);
      free(__ptr->key);
    }
    free(__ptr);
  }
  iVar6.error = '\x06';
  iVar6._1_3_ = 0;
  iVar6.count = 0;
  return iVar6;
}

Assistant:

ion_status_t
sl_insert(
	ion_skiplist_t	*skiplist,
	ion_key_t		key,
	ion_value_t		value
) {
	ion_key_size_t		key_size	= skiplist->super.record.key_size;
	ion_value_size_t	value_size	= skiplist->super.record.value_size;

	ion_sl_node_t *newnode			= malloc(sizeof(ion_sl_node_t));

	if (NULL == newnode) {
		return ION_STATUS_ERROR(err_out_of_memory);
	}

	newnode->key = malloc((size_t) key_size);

	if (NULL == newnode->key) {
		free(newnode);
		return ION_STATUS_ERROR(err_out_of_memory);
	}

	newnode->value = malloc((size_t) value_size);

	if (NULL == newnode->value) {
		free(newnode->key);
		free(newnode);
		return ION_STATUS_ERROR(err_out_of_memory);
	}

	memcpy(newnode->key, key, key_size);
	memcpy(newnode->value, value, value_size);

	/* First we check if there's already a duplicate node. If there is, we're
	   going to do a modified insert instead. */
	ion_sl_node_t *duplicate = sl_find_node(skiplist, key);

	if ((NULL != duplicate->key) && (skiplist->super.compare(duplicate->key, key, key_size) == 0)) {
		/* Child duplicate nodes have no height (which is effectively 1). */
		newnode->height = 0;
		newnode->next	= malloc(sizeof(ion_sl_node_t *) * (newnode->height + 1));

		if (NULL == newnode->next) {
			free(newnode->value);
			free(newnode->key);
			free(newnode);
			return ION_STATUS_ERROR(err_out_of_memory);
		}

		/* We want duplicate to be the last node in the block of duplicate
		 * nodes, so we traverse along the bottom until we get there.
		*/
		while (NULL != duplicate->next[0] && skiplist->super.compare(duplicate->next[0]->key, key, key_size) == 0) {
			duplicate = duplicate->next[0];
		}

		/* Only one height to worry about */
		newnode->next[0]	= duplicate->next[0];
		duplicate->next[0]	= newnode;
	}
	else {
		/* If there's no duplicate node, we do a vanilla insert instead */
		newnode->height = sl_gen_level(skiplist);
		newnode->next	= malloc(sizeof(ion_sl_node_t *) * (newnode->height + 1));

		if (NULL == newnode->next) {
			free(newnode->value);
			free(newnode->key);
			free(newnode);
			return ION_STATUS_ERROR(err_out_of_memory);
		}

		ion_sl_node_t	*cursor = skiplist->head;
		ion_sl_level_t	h;

		for (h = skiplist->head->height; h >= 0; --h) {
			/* The memcmp will return -1 if key is smaller, 0 if equal, 1 if greater. */
			while (NULL != cursor->next[h] && skiplist->super.compare(key, cursor->next[h]->key, key_size) >= 0) {
				cursor = cursor->next[h];
			}

			if (h <= newnode->height) {
				newnode->next[h]	= cursor->next[h];
				cursor->next[h]		= newnode;
			}
		}
	}

	return ION_STATUS_OK(1);
}